

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffobjs.c
# Opt level: O3

void remove_subset_prefix(FT_String *name)

{
  bool bVar1;
  uint uVar2;
  size_t sVar3;
  long lVar4;
  uint uVar5;
  
  sVar3 = strlen(name);
  if (5 < (int)sVar3) {
    uVar5 = (int)sVar3 + 1;
    do {
      if (name[6] != '+') {
        return;
      }
      bVar1 = true;
      lVar4 = 0;
      do {
        if (0x19 < (byte)(name[lVar4] + 0xbfU)) {
          bVar1 = false;
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 != 6);
      if (!bVar1) {
        return;
      }
      uVar2 = 0;
      if (uVar5 != 7) {
        memmove(name,name + 7,(ulong)(uVar5 - 7));
        uVar2 = uVar5 - 7;
      }
      uVar5 = uVar2;
    } while (6 < (int)uVar5);
  }
  return;
}

Assistant:

static void
  remove_subset_prefix( FT_String*  name )
  {
    FT_Int32  idx             = 0;
    FT_Int32  length          = (FT_Int32)ft_strlen( name ) + 1;
    FT_Bool   continue_search = 1;


    while ( continue_search )
    {
      if ( length >= 7 && name[6] == '+' )
      {
        for ( idx = 0; idx < 6; idx++ )
        {
          /* ASCII uppercase letters */
          if ( !( 'A' <= name[idx] && name[idx] <= 'Z' ) )
            continue_search = 0;
        }

        if ( continue_search )
        {
          for ( idx = 7; idx < length; idx++ )
            name[idx - 7] = name[idx];
          length -= 7;
        }
      }
      else
        continue_search = 0;
    }
  }